

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O2

void sysbvm_jit_callWithContextNoResult0(sysbvm_bytecodeJit_t *jit,void *functionPointer)

{
  sysbvm_jit_x86_jitLoadContextInRegister(jit,(sysbvm_x86_register_t)functionPointer);
  sysbvm_jit_x86_call(jit,functionPointer);
  return;
}

Assistant:

SYSBVM_API void sysbvm_jit_callWithContextNoResult0(sysbvm_bytecodeJit_t *jit, void *functionPointer)
{
    sysbvm_jit_x86_jitLoadContextInRegister(jit, SYSBVM_X86_64_ARG0);
    sysbvm_jit_x86_call(jit, functionPointer);
}